

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_swap_2bytes(size_t n,void *ar)

{
  uchar uVar1;
  uchar tval;
  uchar *cp2;
  uchar *cp1;
  size_t ii;
  void *ar_local;
  size_t n_local;
  
  cp2 = (uchar *)ar;
  for (cp1 = (uchar *)0x0; cp1 < n; cp1 = cp1 + 1) {
    uVar1 = *cp2;
    *cp2 = cp2[1];
    cp2[1] = uVar1;
    cp2 = cp2 + 2;
  }
  return;
}

Assistant:

void nifti_swap_2bytes( size_t n , void *ar )    /* 2 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp1 = (unsigned char *)ar, * cp2 ;
   unsigned char   tval;

   for( ii=0 ; ii < n ; ii++ ){
       cp2 = cp1 + 1;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1 += 2;
   }
   return ;
}